

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStencilbufferTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FboStencilTests::init(FboStencilTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TextureFormat TVar3;
  FboTestCase *pFVar4;
  char *pcVar5;
  long *plVar6;
  TestNode *node;
  long *plVar7;
  long lVar8;
  allocator<char> local_81;
  TestNode *local_80;
  TestNode *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic stencil tests");
  local_80 = (TestNode *)this;
  local_78 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar8 = 0;
  do {
    internalFormat = *(deUint32 *)((long)init::stencilFormats + lVar8);
    TVar3 = glu::mapGLInternalFormat(internalFormat);
    pFVar4 = (FboTestCase *)operator_new(0x98);
    pCVar1 = (Context *)local_80[1]._vptr_TestNode;
    pcVar5 = FboTestUtil::getFormatName(internalFormat);
    FboTestCase::FboTestCase(pFVar4,pCVar1,pcVar5,glcts::fixed_sample_locations_values + 1,false);
    (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__FboTestCase_02190728;
    *(deUint32 *)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         internalFormat;
    *(undefined8 *)
     ((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
         0x840000006f;
    *(undefined1 *)((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = 0
    ;
    tcu::TestNode::addChild(local_78,(TestNode *)pFVar4);
    if (TVar3.order == DS) {
      pFVar4 = (FboTestCase *)operator_new(0x98);
      pCVar1 = (Context *)local_80[1]._vptr_TestNode;
      pcVar5 = FboTestUtil::getFormatName(internalFormat);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar5,&local_81);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
      local_70 = &local_60;
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar6[3];
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      FboTestCase::FboTestCase
                (pFVar4,pCVar1,(char *)local_70,glcts::fixed_sample_locations_values + 1,false);
      (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_02190728;
      *(deUint32 *)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           internalFormat;
      *(undefined8 *)
       ((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x840000006f;
      *(undefined1 *)((long)&pFVar4[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
           1;
      tcu::TestNode::addChild(local_78,(TestNode *)pFVar4);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xc);
  node = (TestNode *)operator_new(0x70);
  pTVar2 = local_80;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,local_80->m_testCtx,"attach","Attaching depth stencil");
  tcu::TestNode::addChild(pTVar2,node);
  pFVar4 = (FboTestCase *)operator_new(0x90);
  FboTestCase::FboTestCase
            (pFVar4,(Context *)pTVar2[1]._vptr_TestNode,"depth_only",
             "Only depth part of depth-stencil RBO attached",false);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_02190790;
  pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x8d00;
  tcu::TestNode::addChild(node,(TestNode *)pFVar4);
  pFVar4 = (FboTestCase *)operator_new(0x90);
  FboTestCase::FboTestCase
            (pFVar4,(Context *)pTVar2[1]._vptr_TestNode,"stencil_only",
             "Only stencil part of depth-stencil RBO attached",false);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_02190790;
  pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8d2000000000;
  tcu::TestNode::addChild(node,(TestNode *)pFVar4);
  pFVar4 = (FboTestCase *)operator_new(0x90);
  FboTestCase::FboTestCase
            (pFVar4,(Context *)pTVar2[1]._vptr_TestNode,"depth_stencil_separate",
             "Depth and stencil attached separately",false);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_02190790;
  pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8d2000008d00;
  tcu::TestNode::addChild(node,(TestNode *)pFVar4);
  pFVar4 = (FboTestCase *)operator_new(0x90);
  FboTestCase::FboTestCase
            (pFVar4,(Context *)pTVar2[1]._vptr_TestNode,"depth_stencil_attachment",
             "Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",false);
  (pFVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_02190790;
  pFVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x821a;
  tcu::TestNode::addChild(node,(TestNode *)pFVar4);
  return extraout_EAX;
}

Assistant:

void FboStencilTests::init (void)
{
	static const deUint32 stencilFormats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic stencil tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(stencilFormats); fmtNdx++)
		{
			deUint32			format		= stencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);

			basicGroup->addChild(new BasicFboStencilCase(m_context, getFormatName(format), "", format, IVec2(111, 132), false));

			if (texFmt.order == tcu::TextureFormat::DS)
				basicGroup->addChild(new BasicFboStencilCase(m_context, (string(getFormatName(format)) + "_depth").c_str(), "", format, IVec2(111, 132), true));
		}
	}

	// .attach
	{
		tcu::TestCaseGroup* attachGroup = new tcu::TestCaseGroup(m_testCtx, "attach", "Attaching depth stencil");
		addChild(attachGroup);

		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_only",				"Only depth part of depth-stencil RBO attached",			GL_DEPTH_ATTACHMENT,			GL_NONE));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "stencil_only",				"Only stencil part of depth-stencil RBO attached",			GL_NONE,						GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_separate",	"Depth and stencil attached separately",					GL_DEPTH_ATTACHMENT,			GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_attachment",	"Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",	GL_DEPTH_STENCIL_ATTACHMENT,	GL_NONE));
	}
}